

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

bool GEO::check_same_vec(vector<int,_std::allocator<int>_> *first,
                        vector<int,_std::allocator<int>_> *second)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  const_iterator second_it;
  const_iterator second_end;
  const_iterator first_it;
  const_iterator first_end;
  vector<int,_std::allocator<int>_> *second_local;
  vector<int,_std::allocator<int>_> *first_local;
  
  sVar3 = std::vector<int,_std::allocator<int>_>::size(first);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(second);
  if (sVar3 == sVar4) {
    first_it = std::vector<int,_std::allocator<int>_>::end(first);
    second_end = std::vector<int,_std::allocator<int>_>::begin(first);
    while (bVar2 = __gnu_cxx::operator!=(&second_end,&first_it), bVar2) {
      second_it = std::vector<int,_std::allocator<int>_>::end(second);
      local_40._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(second);
      while (bVar2 = __gnu_cxx::operator!=(&local_40,&second_it), bVar2) {
        piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&second_end);
        iVar1 = *piVar5;
        piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_40);
        if (iVar1 != *piVar5) {
          return false;
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_40,0);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&second_end,0);
    }
    first_local._7_1_ = true;
  }
  else {
    first_local._7_1_ = false;
  }
  return first_local._7_1_;
}

Assistant:

bool GEO::check_same_vec(const std::vector<int> &first, const std::vector<int> &second)
{
    if( first.size() == second.size() )
    {
        auto first_end = first.end();
        for ( auto first_it = first.begin(); first_it != first_end; first_it++)
        {
            auto second_end = second.end();
            for ( auto second_it = second.begin(); second_it != second_end; second_it++)
            {
                if (*first_it!=*second_it)
                    return  false;
            }
        }
        return true;
    }
    return false;
}